

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  char cVar3;
  ImGuiContext *g;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float extraout_XMM0_Db;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar14;
  float fVar15;
  undefined1 auVar12 [16];
  float fVar16;
  undefined1 auVar13 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float local_28;
  float fStack_24;
  
  pIVar1 = GImGui;
  fVar7 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar7 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar7 = fVar7 * window->ParentWindow->FontWindowScale;
    }
    fVar20 = (GImGui->Style).FramePadding.y;
    fVar7 = fVar20 + fVar20 + fVar7;
  }
  fVar8 = ImGuiWindow::MenuBarHeight(window);
  fVar20 = (window->WindowPadding).x;
  fVar17 = (window->WindowPadding).y;
  fVar20 = fVar20 + fVar20;
  fVar17 = fVar17 + fVar17;
  local_28 = size_contents->x + fVar20;
  fStack_24 = fVar8 + fVar7 + size_contents->y + fVar17;
  fVar23 = extraout_XMM0_Db + 0.0;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    auVar12._8_8_ = 0;
    auVar12._0_4_ = (pIVar1->Style).WindowMinSize.x;
    auVar12._4_4_ = (pIVar1->Style).WindowMinSize.y;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar12 = minps(auVar12,_DAT_001c7010);
    }
    IVar9 = (pIVar1->Style).DisplaySafeAreaPadding;
    fVar14 = IVar9.x;
    fVar11 = IVar9.y;
    IVar9 = (pIVar1->IO).DisplaySize;
    fVar18 = IVar9.x - (fVar14 + fVar14);
    fVar19 = IVar9.y - (fVar11 + fVar11);
    fVar11 = auVar12._0_4_;
    fVar14 = auVar12._4_4_;
    fVar15 = auVar12._8_4_;
    fVar16 = auVar12._12_4_;
    uVar4 = -(uint)(fVar18 <= fVar11);
    uVar5 = -(uint)(fVar19 <= fVar14);
    fVar21 = (float)((uint)fVar15 & -(uint)(0.0 <= fVar15));
    fVar22 = (float)((uint)fVar16 & -(uint)(0.0 <= fVar16));
    fVar18 = (float)(~uVar4 & (uint)fVar18 | (uint)fVar11 & uVar4);
    fVar19 = (float)(~uVar5 & (uint)fVar19 | (uint)fVar14 & uVar5);
    uVar4 = -(uint)(fVar18 < local_28);
    uVar5 = -(uint)(fVar19 < fStack_24);
    uVar6 = -(uint)(fVar22 < fVar23);
    auVar13._0_4_ = (uint)fVar11 & -(uint)(local_28 < fVar11);
    auVar13._4_4_ = (uint)fVar14 & -(uint)(fStack_24 < fVar14);
    auVar13._8_4_ = (uint)fVar15 & -(uint)(0.0 < fVar15);
    auVar13._12_4_ = (uint)fVar16 & -(uint)(fVar23 < fVar16);
    auVar10._0_4_ =
         ~-(uint)(local_28 < fVar11) & (~uVar4 & (uint)(local_28 + 0.0) | (uint)fVar18 & uVar4);
    auVar10._4_4_ = ~-(uint)(fStack_24 < fVar14) & (~uVar5 & (uint)fStack_24 | (uint)fVar19 & uVar5)
    ;
    auVar10._8_4_ = ~-(uint)(0.0 < fVar15) & (uint)fVar21 & -(uint)(fVar21 < 0.0);
    auVar10._12_4_ = ~-(uint)(fVar23 < fVar16) & (~uVar6 & (uint)fVar23 | (uint)fVar22 & uVar6);
    auVar10 = auVar10 | auVar13;
    IVar9 = CalcWindowSizeAfterConstraint(window,auVar10._0_8_);
    uVar4 = window->Flags;
    bVar2 = 1;
    cVar3 = '\x01';
    if (size_contents->x <= IVar9.x - fVar20 || (uVar4 & 0x808) != 0x800) {
      cVar3 = (char)((uVar4 & 0xffff) >> 0xf);
    }
    if (size_contents->y <= (IVar9.y - fVar17) - (fVar8 + fVar7) || (uVar4 & 8) != 0) {
      bVar2 = (byte)(uVar4 >> 0xe) & 1;
    }
    local_28 = auVar10._0_4_;
    fStack_24 = auVar10._4_4_;
    if (cVar3 != '\0') {
      fStack_24 = fStack_24 + (pIVar1->Style).ScrollbarSize;
    }
    if (bVar2 != 0) {
      local_28 = local_28 + (pIVar1->Style).ScrollbarSize;
    }
  }
  else {
    local_28 = local_28 + 0.0;
  }
  IVar9.y = fStack_24;
  IVar9.x = local_28;
  return IVar9;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}